

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.hpp
# Opt level: O0

type asio::
     async_read<asio::basic_stream_socket<asio::ip::tcp,asio::stream_socket_service<asio::ip::tcp>>,asio::basic_streambuf_ref<std::allocator<char>>,asio::detail::transfer_exactly_t,tonk::gateway::HTTPRequester::ContinueReadingBody()::__0>
               (basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_> *s,
               basic_streambuf_ref<std::allocator<char>_> *buffers,
               transfer_exactly_t completion_condition,anon_class_8_1_8991fb9c_for_handler_ *handler
               ,type *param_5)

{
  basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_> *in_RDX;
  int in_stack_0000000c;
  size_t in_stack_00000010;
  error_code *in_stack_00000018;
  read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>
  *in_stack_00000020;
  async_completion<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9),_void_(std::error_code,_unsigned_long)>
  init;
  anon_class_8_1_8991fb9c_for_handler_ *in_stack_ffffffffffffff78;
  error_code *in_stack_ffffffffffffff80;
  basic_streambuf_ref<std::allocator<char>_> *in_stack_ffffffffffffff88;
  read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>
  *in_stack_ffffffffffffff98;
  transfer_exactly_t in_stack_ffffffffffffffa0;
  async_result<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>
  aaStack_30 [40];
  basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_> *local_8;
  
  local_8 = in_RDX;
  async_completion<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1725:9),_void_(std::error_code,_unsigned_long)>
  ::async_completion((async_completion<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9),_void_(std::error_code,_unsigned_long)>
                      *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  detail::
  read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,asio::stream_socket_service<asio::ip::tcp>>,asio::basic_streambuf_ref<std::allocator<char>>,asio::detail::transfer_exactly_t,tonk::gateway::HTTPRequester::ContinueReadingBody()::$_0>
  ::read_dynbuf_op<asio::basic_streambuf_ref<std::allocator<char>>>
            (in_stack_ffffffffffffff98,local_8,in_stack_ffffffffffffff88,in_stack_ffffffffffffffa0,
             (anon_class_8_1_8991fb9c_for_handler_ *)in_stack_ffffffffffffff80);
  std::error_code::error_code(in_stack_ffffffffffffff80);
  detail::
  read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1725:9)>
  ::operator()(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_0000000c);
  async_result<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1725:9)>
  ::get(aaStack_30);
  return;
}

Assistant:

async_read(AsyncReadStream& s,
    ASIO_MOVE_ARG(DynamicBufferSequence) buffers,
    CompletionCondition completion_condition,
    ASIO_MOVE_ARG(ReadHandler) handler,
    typename enable_if<
      is_dynamic_buffer_sequence<DynamicBufferSequence>::value
    >::type*)
{
  // If you get an error on the following line it means that your handler does
  // not meet the documented type requirements for a ReadHandler.
  ASIO_READ_HANDLER_CHECK(ReadHandler, handler) type_check;

  async_completion<ReadHandler,
    void (asio::error_code, std::size_t)> init(handler);

  detail::read_dynbuf_op<AsyncReadStream,
    typename decay<DynamicBufferSequence>::type,
      CompletionCondition, ASIO_HANDLER_TYPE(
        ReadHandler, void (asio::error_code, std::size_t))>(
          s, ASIO_MOVE_CAST(DynamicBufferSequence)(buffers),
            completion_condition, init.handler)(
              asio::error_code(), 0, 1);

  return init.result.get();
}